

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.h
# Opt level: O2

FaceData * __thiscall Ptex::v2_2::PtexReader::errorData(PtexReader *this,bool deleteOnRelease)

{
  ErrorFace *this_00;
  
  this_00 = (ErrorFace *)operator_new(0x20);
  ErrorFace::ErrorFace
            (this_00,(this->_errorPixel).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start,this->_pixelsize,deleteOnRelease);
  return (FaceData *)this_00;
}

Assistant:

FaceData* errorData(bool deleteOnRelease=false)
    {
        return new ErrorFace(&_errorPixel[0], _pixelsize, deleteOnRelease);
    }